

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O0

string * __thiscall
MPL::detail::ModelPackageImpl::setRootModel
          (string *__return_storage_ptr__,ModelPackageImpl *this,path *path,string *name,
          string *author,string *description)

{
  char *pcVar1;
  bool bVar2;
  pointer pJVar3;
  runtime_error *this_00;
  allocator<char> local_91;
  string local_90;
  undefined1 local_6d;
  allocator<char> local_59;
  string local_58;
  string *local_38;
  string *description_local;
  string *author_local;
  string *name_local;
  path *path_local;
  ModelPackageImpl *this_local;
  string *identifier;
  
  local_38 = description;
  description_local = author;
  author_local = name;
  name_local = &path->_M_pathname;
  path_local = &this->m_packagePath;
  this_local = (ModelPackageImpl *)__return_storage_ptr__;
  pJVar3 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->(&this->m_manifest);
  pcVar1 = kModelPackageRootModelKey;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,pcVar1,&local_59);
  bVar2 = JsonMap::hasKey(pJVar3,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  if (bVar2) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"A root model already exists in this package");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_6d = 0;
  addItem(__return_storage_ptr__,this,(path *)name_local,author_local,description_local,local_38);
  pJVar3 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->(&this->m_manifest);
  pcVar1 = kModelPackageRootModelKey;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,pcVar1,&local_91);
  JsonMap::setString(pJVar3,&local_90,__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  return __return_storage_ptr__;
}

Assistant:

std::string ModelPackageImpl::setRootModel(const std::filesystem::path& path, const std::string& name, const std::string& author, const std::string& description)
{
    if (m_manifest->hasKey(kModelPackageRootModelKey)) {
        throw std::runtime_error("A root model already exists in this package");
    }
    
    auto identifier = addItem(path, name, author, description);
    m_manifest->setString(kModelPackageRootModelKey, identifier);
    return identifier;
}